

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

_glist * template_findcanvas(t_template *template)

{
  _gtemplate *gt;
  t_template *template_local;
  
  if (template == (t_template *)0x0) {
    bug("template_findcanvas");
    template_local = (t_template *)0x0;
  }
  else if (template->t_list == (_gtemplate *)0x0) {
    template_local = (t_template *)0x0;
  }
  else {
    template_local = (t_template *)template->t_list->x_owner;
  }
  return (_glist *)template_local;
}

Assistant:

t_canvas *template_findcanvas(t_template *template)
{
    t_gtemplate *gt;
    if (!template)
    {
        bug("template_findcanvas");
        return (0);
    }
    if (!(gt = template->t_list))
        return (0);
    return (gt->x_owner);
    /* return ((t_canvas *)pd_findbyclass(template->t_sym, canvas_class)); */
}